

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O2

void * mi_recalloc_aligned(void *p,size_t newcount,size_t size,size_t alignment)

{
  void *pvVar1;
  long in_FS_OFFSET;
  
  pvVar1 = mi_heap_recalloc_aligned(*(mi_heap_t **)(in_FS_OFFSET + -0x60),p,newcount,size,alignment)
  ;
  return pvVar1;
}

Assistant:

mi_decl_nodiscard void* mi_recalloc_aligned(void* p, size_t newcount, size_t size, size_t alignment) mi_attr_noexcept {
  return mi_heap_recalloc_aligned(mi_prim_get_default_heap(), p, newcount, size, alignment);
}